

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadDistantLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  XMLLoader *this_01;
  float fVar2;
  Vec3fa VVar3;
  Vec3fa L;
  AffineSpace3fa space;
  undefined1 local_b8 [12];
  float local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  SharedState *local_68;
  _Alloc_hider _Stack_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38 [2];
  
  this_01 = (XMLLoader *)local_b8;
  this_00 = (XMLLoader *)*in_RDX;
  local_98._0_2_ = 0x6641;
  local_98._2_5_ = 0x53656e6966;
  local_98[7] = 0x70;
  local_98._8_2_ = 0x6361;
  local_98[10] = 0x65;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  local_98[0xb] = 0;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_88,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)local_58,this_00,(Ref<embree::XML> *)local_88);
  if ((long *)local_88._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_88._0_8_ + 0x18))();
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  childID = (string *)*in_RDX;
  local_98._0_2_ = 0x4c;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_b8,childID);
  VVar3 = load<embree::Vec3fa>((XMLLoader *)local_88,(Ref<embree::XML> *)childID);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))(VVar3.field_0._0_4_,VVar3.field_0._8_4_);
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  local_98._0_2_ = 0x6168;
  local_98._2_5_ = 0x676e41666c;
  local_98[7] = 0x6c;
  local_98._8_2_ = 0x65;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
  local_a8._M_allocated_capacity = (size_type)(element_type *)local_98;
  XML::child((XML *)local_b8,(string *)*in_RDX);
  local_ac = load<float>(this_01,(Ref<embree::XML> *)local_b8);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b8._0_8_ + 0x18))();
  }
  if ((element_type *)local_a8._M_allocated_capacity != (element_type *)local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
  }
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f800000;
  local_68 = (SharedState *)local_88._0_8_;
  _Stack_60._M_p = (pointer)local_88._8_8_;
  local_98._0_2_ = (undefined2)local_88._0_8_;
  local_98._2_5_ = SUB85(local_88._0_8_,2);
  local_98[7] = SUB81(local_88._0_8_,7);
  local_98._8_2_ = (undefined2)local_88._8_8_;
  local_98[10] = SUB81(local_88._8_8_,2);
  local_98[0xb] = SUB81(local_88._8_8_,3);
  local_98._12_4_ = SUB84(local_88._8_8_,4);
  local_b8._8_4_ = local_ac * 0.017453292;
  cosf((float)local_b8._8_4_);
  pcVar1 = (pointer)alignedMalloc(0xb0,0x10);
  local_78._M_allocated_capacity._0_4_ =
       (float)local_58._0_4_ * 0.0 +
       (float)local_a8._M_allocated_capacity._4_4_ * (float)local_48._M_allocated_capacity._0_4_ +
       (float)local_a8._8_4_ * (float)local_38[0]._0_4_;
  local_78._M_allocated_capacity._4_4_ =
       (float)local_58._4_4_ * 0.0 +
       (float)local_a8._M_allocated_capacity._4_4_ * (float)local_48._M_allocated_capacity._4_4_ +
       (float)local_a8._8_4_ * (float)local_38[0]._4_4_;
  local_78._8_4_ =
       (float)local_58._8_4_ * 0.0 +
       (float)local_a8._M_allocated_capacity._4_4_ * (float)local_48._8_4_ +
       (float)local_a8._8_4_ * (float)local_38[0]._8_4_;
  local_78._12_4_ =
       (float)local_58._12_4_ * 0.0 +
       (float)local_a8._M_allocated_capacity._4_4_ * (float)local_48._12_4_ +
       (float)local_a8._8_4_ * (float)local_38[0]._12_4_;
  fVar2 = cosf((float)local_b8._8_4_);
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  *(pointer *)(pcVar1 + 0x10) = pcVar1 + 0x20;
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  *(pointer *)(pcVar1 + 0x30) = pcVar1 + 0x40;
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x50] = '\0';
  pcVar1[0x51] = '\0';
  pcVar1[0x52] = '\0';
  pcVar1[0x53] = '\0';
  pcVar1[0x54] = '\0';
  pcVar1[0x55] = '\0';
  pcVar1[0x56] = '\0';
  pcVar1[0x57] = '\0';
  pcVar1[0x58] = '\0';
  pcVar1[0x59] = '\0';
  pcVar1[0x5c] = -1;
  pcVar1[0x5d] = -1;
  pcVar1[0x5e] = -1;
  pcVar1[0x5f] = -1;
  pcVar1[0x60] = '\0';
  pcVar1[0x61] = '\0';
  pcVar1[0x62] = '\0';
  pcVar1[99] = '\0';
  pcVar1[100] = '\0';
  pcVar1[0x65] = '\0';
  pcVar1[0x66] = '\0';
  pcVar1[0x67] = '\0';
  *(undefined ***)pcVar1 = &PTR__Node_002c5a48;
  pcVar1[0x70] = '\x04';
  pcVar1[0x71] = '\0';
  pcVar1[0x72] = '\0';
  pcVar1[0x73] = '\0';
  *(ulong *)(pcVar1 + 0x80) =
       CONCAT44(local_78._M_allocated_capacity._4_4_,local_78._M_allocated_capacity._0_4_);
  *(ulong *)(pcVar1 + 0x88) = CONCAT44(local_78._12_4_,local_78._8_4_);
  *(SharedState **)(pcVar1 + 0x90) = local_68;
  *(pointer *)(pcVar1 + 0x98) = _Stack_60._M_p;
  *(float *)(pcVar1 + 0xa0) = local_ac;
  *(undefined4 *)(pcVar1 + 0xa4) = local_b8._8_4_;
  *(float *)(pcVar1 + 0xa8) = fVar2;
  (this->path).filename._M_dataplus._M_p = pcVar1;
  LOCK();
  *(long *)(pcVar1 + 8) = *(long *)(pcVar1 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadDistantLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa D = Vec3fa(0,0,1);
    const float halfAngle = load<float>(xml->child("halfAngle"));
    const SceneGraph::DistantLight light = SceneGraph::DistantLight(D,L,halfAngle);
    return new SceneGraph::LightNodeImpl<SceneGraph::DistantLight>(light.transform(space));
  }